

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O3

void Minisat::parseOptions(int *argc,char **argv,bool strict)

{
  char *pcVar1;
  int iVar2;
  vec<Minisat::Option_*,_int> *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int k;
  char cVar7;
  Option *pOVar8;
  int local_40;
  
  iVar2 = *argc;
  local_40 = 0;
  if (1 < iVar2) {
    local_40 = 1;
    lVar6 = 1;
    pOVar8 = (Option *)argc;
    do {
      lVar4 = lVar6;
      iVar2 = (int)pOVar8;
      pcVar1 = argv[lVar4];
      if ((*pcVar1 == '-') && (pcVar1[1] == '-')) {
        lVar6 = 0;
        cVar7 = *Option::getHelpPrefixString()::help_prefix_str;
        while (cVar7 != '\0') {
          if (pcVar1[lVar6 + 2] != cVar7) goto LAB_006161cc;
          lVar5 = lVar6 + 1;
          lVar6 = lVar6 + 1;
          cVar7 = Option::getHelpPrefixString()::help_prefix_str[lVar5];
        }
        cVar7 = 'h';
        lVar5 = 0;
        do {
          if (pcVar1[lVar5 + lVar6 + 2] != cVar7) goto LAB_006161cc;
          cVar7 = "--help"[lVar5 + 3];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        if (pcVar1[lVar6 + 6] == '\0') {
LAB_0061626a:
          printUsageAndExit(iVar2,argv,false);
          return;
        }
        cVar7 = '-';
        lVar5 = 0;
        while (pcVar1[lVar5 + lVar6 + 6] == cVar7) {
          cVar7 = "-verb"[lVar5 + 1];
          lVar5 = lVar5 + 1;
          if (lVar5 == 5) {
            printUsageAndExit(iVar2,argv,true);
LAB_00616262:
            iVar2 = (int)pOVar8;
            parseOptions();
            goto LAB_0061626a;
          }
        }
      }
      else {
LAB_006161cc:
        lVar6 = 0;
        do {
          pvVar3 = Option::getOptionList();
          if (pvVar3->sz <= lVar6) {
            pOVar8 = (Option *)argv[lVar4];
            if ((strict) && (*(char *)&pOVar8->_vptr_Option == '-')) goto LAB_00616262;
            lVar6 = (long)local_40;
            local_40 = local_40 + 1;
            argv[lVar6] = (char *)pOVar8;
            break;
          }
          pvVar3 = Option::getOptionList();
          pOVar8 = pvVar3->data[lVar6];
          iVar2 = (*pOVar8->_vptr_Option[2])(pOVar8,argv[lVar4]);
          lVar6 = lVar6 + 1;
        } while ((char)iVar2 == '\0');
      }
      iVar2 = *argc;
      lVar6 = lVar4 + 1;
    } while (lVar4 + 1 < (long)iVar2);
    local_40 = local_40 + ~(uint)lVar4;
  }
  *argc = iVar2 + local_40;
  return;
}

Assistant:

void Minisat::parseOptions(int& argc, char** argv, bool strict)
{
    int i, j;
    for (i = j = 1; i < argc; i++){
        const char* str = argv[i];
        if (match(str, "--") && match(str, Option::getHelpPrefixString()) && match(str, "help")){
            if (*str == '\0')
                printUsageAndExit(argc, argv);
            else if (match(str, "-verb"))
                printUsageAndExit(argc, argv, true);
        } else {
            bool parsed_ok = false;
        
            for (int k = 0; !parsed_ok && k < Option::getOptionList().size(); k++){
                parsed_ok = Option::getOptionList()[k]->parse(argv[i]);

                // fprintf(stderr, "checking %d: %s against flag <%s> (%s)\n", i, argv[i], Option::getOptionList()[k]->name, parsed_ok ? "ok" : "skip");
            }

            if (!parsed_ok){
                if (strict && match(argv[i], "-"))
                    fprintf(stderr, "ERROR! Unknown flag \"%s\". Use '--%shelp' for help.\n", argv[i], Option::getHelpPrefixString()), exit(1);
                else
                    argv[j++] = argv[i];
            }
        }
    }

    argc -= (i - j);
}